

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Checker.h
# Opt level: O2

void soul::heart::Checker::testHEARTRoundTrip(Program *program)

{
  __type_conflict1 _Var1;
  int in_ECX;
  Program *in_RDX;
  void *__child_stack;
  Program *p;
  void *in_R8;
  Program PVar2;
  string dump;
  allocator<char> local_a9;
  undefined1 local_a8 [32];
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  Printer::getDump_abi_cxx11_(&local_68,(Printer *)program,in_RDX);
  Program::clone((Program *)local_a8,(__fn *)program,__child_stack,in_ECX,in_R8);
  Printer::getDump_abi_cxx11_((string *)(local_a8 + 0x20),(Printer *)local_a8,p);
  _Var1 = std::operator==(&local_68,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_a8 + 0x20));
  if (!_Var1) {
    throwInternalCompilerError("dump == program.clone().toHEART()","testHEARTRoundTrip",0x1a9);
  }
  std::__cxx11::string::~string((string *)(local_a8 + 0x20));
  RefCountedPtr<soul::Program::ProgramImpl>::~RefCountedPtr
            ((RefCountedPtr<soul::Program::ProgramImpl> *)(local_a8 + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"internal test dump",&local_a9);
  std::__cxx11::string::string((string *)&local_48,(string *)&local_68);
  CodeLocation::createFromString((CodeLocation *)(local_a8 + 0x10),&local_28,&local_48);
  PVar2 = Parser::parse((Parser *)local_a8,(CodeLocation *)(local_a8 + 0x10));
  Printer::getDump_abi_cxx11_
            ((string *)(local_a8 + 0x20),(Printer *)local_a8,
             (Program *)PVar2.refHolder.object.object);
  _Var1 = std::operator==(&local_68,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_a8 + 0x20));
  if (_Var1) {
    std::__cxx11::string::~string((string *)(local_a8 + 0x20));
    RefCountedPtr<soul::Program::ProgramImpl>::~RefCountedPtr
              ((RefCountedPtr<soul::Program::ProgramImpl> *)(local_a8 + 8));
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)(local_a8 + 0x10));
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::~string((string *)&local_68);
    return;
  }
  throwInternalCompilerError
            ("dump == heart::Parser::parse (CodeLocation::createFromString (\"internal test dump\", dump)).toHEART()"
             ,"testHEARTRoundTrip",0x1aa);
}

Assistant:

static void testHEARTRoundTrip (const Program& program)
    {
        ignoreUnused (program);

       #if SOUL_ENABLE_ASSERTIONS && (SOUL_TEST_HEART_ROUNDTRIP || (SOUL_DEBUG && ! defined (SOUL_TEST_HEART_ROUNDTRIP)))
        auto dump = program.toHEART();
        SOUL_ASSERT (dump == program.clone().toHEART());
        SOUL_ASSERT (dump == heart::Parser::parse (CodeLocation::createFromString ("internal test dump", dump)).toHEART());
       #endif
    }